

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O3

void RegisterHTTPHandler(string *prefix,bool exactMatch,HTTPRequestHandler *handler)

{
  long lVar1;
  bool bVar2;
  Logger *this;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  undefined7 uStack_30;
  bool exactMatch_local;
  UniqueLock<GlobalMutex> criticalblock13;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  exactMatch_local = exactMatch;
  this = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(this,HTTP,Debug);
  if (bVar2) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "RegisterHTTPHandler";
    logging_function._M_len = 0x13;
    LogPrintf_<std::__cxx11::string,bool>
              (logging_function,source_file,0x2ef,
               IPC|I2P|VALIDATION|LEVELDB|QT|MEMPOOLREJ|PRUNE|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|
               WALLETDB|ZMQ,(Level)prefix,&exactMatch_local,in_stack_ffffffffffffffc8,
               (bool *)CONCAT17(exactMatch_local,uStack_30));
  }
  criticalblock13.super_unique_lock._M_device = (mutex_type *)&g_httppathhandlers_mutex;
  criticalblock13.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock13.super_unique_lock);
  std::vector<HTTPPathHandler,std::allocator<HTTPPathHandler>>::
  emplace_back<std::__cxx11::string_const&,bool&,std::function<bool(HTTPRequest*,std::__cxx11::string_const&)>const&>
            ((vector<HTTPPathHandler,std::allocator<HTTPPathHandler>> *)&pathHandlers,prefix,
             &exactMatch_local,handler);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterHTTPHandler(const std::string &prefix, bool exactMatch, const HTTPRequestHandler &handler)
{
    LogDebug(BCLog::HTTP, "Registering HTTP handler for %s (exactmatch %d)\n", prefix, exactMatch);
    LOCK(g_httppathhandlers_mutex);
    pathHandlers.emplace_back(prefix, exactMatch, handler);
}